

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O1

int mipmap_image(uchar *orig,int width,int height,int channels,uchar *resampled,int block_size_x,
                int block_size_y)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int v_block;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int block_area;
  int local_48;
  
  iVar3 = 0;
  iVar14 = 0;
  if ((((0 < block_size_y) && (iVar14 = 0, 0 < block_size_x)) &&
      (iVar14 = iVar3, resampled != (uchar *)0x0)) &&
     (((orig != (uchar *)0x0 && (0 < width)) && ((0 < height && (0 < channels)))))) {
    iVar14 = 0;
    uVar15 = (uint)width / (uint)block_size_x;
    uVar7 = 1;
    if (1 < (int)uVar15) {
      uVar7 = uVar15;
    }
    lVar5 = 0;
    do {
      local_48 = (int)lVar5;
      lVar5 = lVar5 + 1;
      iVar3 = height - local_48 * block_size_y;
      if ((int)lVar5 * block_size_y <= height) {
        iVar3 = block_size_y;
      }
      local_48 = local_48 * uVar7;
      lVar6 = 0;
      iVar13 = iVar14;
      do {
        lVar1 = lVar6 + 1;
        uVar2 = width - (int)lVar6 * block_size_y;
        if (lVar1 * (ulong)(uint)block_size_x < (ulong)(uint)width ||
            lVar1 * (ulong)(uint)block_size_x - (ulong)(uint)width == 0) {
          uVar2 = block_size_x;
        }
        iVar9 = (int)(uVar2 * iVar3) >> 1;
        uVar16 = 0;
        iVar11 = iVar13;
        do {
          iVar4 = iVar9;
          if (0 < iVar3) {
            iVar8 = 0;
            iVar12 = iVar11;
            do {
              uVar10 = (ulong)uVar2;
              iVar17 = iVar12;
              if (0 < (int)uVar2) {
                do {
                  iVar4 = iVar4 + (uint)orig[iVar17];
                  uVar10 = uVar10 - 1;
                  iVar17 = iVar17 + channels;
                } while (uVar10 != 0);
              }
              iVar8 = iVar8 + 1;
              iVar12 = iVar12 + channels * width;
            } while (iVar8 < iVar3);
          }
          resampled[uVar16 + (long)(((int)lVar6 + local_48) * channels)] =
               (uchar)(iVar4 / (int)(uVar2 * iVar3));
          uVar16 = uVar16 + 1;
          iVar11 = iVar11 + 1;
        } while (uVar16 != (uint)channels);
        iVar13 = iVar13 + block_size_x * channels;
        lVar6 = lVar1;
      } while (lVar1 < (int)uVar15);
      iVar14 = iVar14 + channels * width * block_size_y;
    } while (lVar5 < (int)((uint)height / (uint)block_size_y));
    iVar14 = 1;
  }
  return iVar14;
}

Assistant:

int
	mipmap_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int block_size_x, int block_size_y
	)
{
	int mip_width, mip_height;
	int i, j, c;

	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) ||
		(resampled == NULL) ||
		(block_size_x < 1) || (block_size_y < 1) )
	{
		/*	nothing to do	*/
		return 0;
	}
	mip_width = width / block_size_x;
	mip_height = height / block_size_y;
	if( mip_width < 1 )
	{
		mip_width = 1;
	}
	if( mip_height < 1 )
	{
		mip_height = 1;
	}
	for( j = 0; j < mip_height; ++j )
	{
		for( i = 0; i < mip_width; ++i )
		{
			for( c = 0; c < channels; ++c )
			{
				const int index = (j*block_size_y)*width*channels + (i*block_size_x)*channels + c;
				int sum_value;
				int u,v;
				int u_block = block_size_x;
				int v_block = block_size_y;
				int block_area;
				/*	do a bit of checking so we don't over-run the boundaries
					(necessary for non-square textures!)	*/
				if( block_size_x * (i+1) > width )
				{
					u_block = width - i*block_size_y;
				}
				if( block_size_y * (j+1) > height )
				{
					v_block = height - j*block_size_y;
				}
				block_area = u_block*v_block;
				/*	for this pixel, see what the average
					of all the values in the block are.
					note: start the sum at the rounding value, not at 0	*/
				sum_value = block_area >> 1;
				for( v = 0; v < v_block; ++v )
				for( u = 0; u < u_block; ++u )
				{
					sum_value += orig[index + v*width*channels + u*channels];
				}
				resampled[j*mip_width*channels + i*channels + c] = sum_value / block_area;
			}
		}
	}
	return 1;
}